

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_mismatch.cpp
# Opt level: O0

int main(void)

{
  pointer *this;
  iterator __first;
  iterator __last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  const_iterator local_78;
  allocator<int> local_6d;
  value_type local_6c;
  undefined1 local_68 [8];
  vector<int,_std::allocator<int>_> v3;
  allocator<int> local_3d;
  value_type local_3c;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  local_3c = 4;
  std::allocator<int>::allocator(&local_3d);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_38,2,&local_3c,&local_3d);
  std::allocator<int>::~allocator(&local_3d);
  local_6c = 4;
  std::allocator<int>::allocator(&local_6d);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,3,&local_6c,&local_6d);
  std::allocator<int>::~allocator(&local_6d);
  this = &v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
  local_80._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)this);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_78,
             &local_80);
  __first = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)local_38);
  __last = std::vector<int,_std::allocator<int>_>::end
                     ((vector<int,_std::allocator<int>_> *)local_68);
  std::vector<int,std::allocator<int>>::
  insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)this,local_78,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_68);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  return 0;
}

Assistant:

int main()
{
  std::vector<int> v;
  std::vector<int> v2(2,4);
  std::vector<int> v3(3,4);

  v.insert(v.begin(), v2.begin(), v3.end());

}